

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O2

void __thiscall
xLearn::F1Metric::Accumulate
          (F1Metric *this,vector<float,_std::allocator<float>_> *Y,
          vector<float,_std::allocator<float>_> *pred)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_type sVar5;
  ostream *poVar6;
  index_t iVar7;
  long lVar8;
  allocator_type local_ba;
  allocator local_b9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sum_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sum_1;
  string local_78;
  long local_58;
  vector<float,_std::allocator<float>_> *local_50;
  vector<float,_std::allocator<float>_> *local_48;
  
  uVar2 = (long)(Y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(Y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar2 == (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start) {
    this->total_example_ = this->total_example_ + (int)(uVar2 >> 2);
    local_78._M_dataplus._M_p = local_78._M_dataplus._M_p & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&sum_1,(this->super_Metric).threadNumber_,(value_type_conflict3 *)&local_78,
               (allocator_type *)&sum_2);
    local_78._M_dataplus._M_p = local_78._M_dataplus._M_p & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&sum_2,(this->super_Metric).threadNumber_,(value_type_conflict3 *)&local_78,&local_ba
              );
    lVar8 = 0;
    uVar2 = 0;
    while (uVar1 = (this->super_Metric).threadNumber_, uVar2 < uVar1) {
      uVar3 = (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      uVar4 = uVar3 / uVar1;
      sVar5 = uVar4 * (uVar2 + 1);
      local_78.field_2._M_allocated_capacity = uVar4 * uVar2;
      local_78._M_dataplus._M_p = (pointer)f1_accum_thread;
      local_78._M_string_length = uVar3 % uVar1 + sVar5;
      if (uVar2 != uVar1 - 1) {
        local_78._M_string_length = sVar5;
      }
      local_58 = (long)sum_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar8;
      local_78.field_2._8_8_ =
           CONCAT44(sum_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start._4_4_,
                    sum_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start._0_4_) + lVar8;
      local_50 = pred;
      local_48 = Y;
      ThreadPool::
      enqueue<std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,unsigned_int*,unsigned_int*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,unsigned_int*,unsigned_int*,unsigned_long,unsigned_long)>>
                ((ThreadPool *)&stack0xffffffffffffffc0,
                 (_Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long)>
                  *)(this->super_Metric).pool_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
      lVar8 = lVar8 + 4;
      uVar2 = uVar2 + 1;
    }
    ThreadPool::Sync((this->super_Metric).pool_,(int)uVar1);
    iVar7 = this->true_positive_;
    for (lVar8 = 0;
        (long)sum_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)sum_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2 != lVar8; lVar8 = lVar8 + 1) {
      iVar7 = iVar7 + sum_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar8];
      this->true_positive_ = iVar7;
    }
    iVar7 = this->true_negative_;
    for (lVar8 = 0;
        (long)sum_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        CONCAT44(sum_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_,
                 sum_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_) >> 2 != lVar8; lVar8 = lVar8 + 1) {
      iVar7 = iVar7 + *(int *)(CONCAT44(sum_2.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                        sum_2.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar8 * 4
                              );
      this->true_negative_ = iVar7;
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&sum_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&sum_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    return;
  }
  sum_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 2;
  std::__cxx11::string::string
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
             ,(allocator *)&local_ba);
  std::__cxx11::string::string((string *)&sum_1,"Accumulate",&local_b9);
  poVar6 = Logger::Start(ERR,&local_78,0x198,(string *)&sum_1);
  poVar6 = std::operator<<(poVar6,"CHECK_EQ failed ");
  poVar6 = std::operator<<(poVar6,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
                          );
  poVar6 = std::operator<<(poVar6,":");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x198);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"Y.size()");
  poVar6 = std::operator<<(poVar6," = ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"pred.size()");
  poVar6 = std::operator<<(poVar6," = ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6,"\n");
  std::__cxx11::string::~string((string *)&sum_1);
  std::__cxx11::string::~string((string *)&local_78);
  Logger::~Logger((Logger *)&sum_2);
  abort();
}

Assistant:

void Accumulate(const std::vector<real_t>& Y,
                  const std::vector<real_t>& pred) {
    CHECK_EQ(Y.size(), pred.size());
    total_example_ += Y.size();
    // multi-thread training
    std::vector<index_t> sum_1(threadNumber_, 0);
    std::vector<index_t> sum_2(threadNumber_, 0);
    for (int i = 0; i < threadNumber_; ++i) {
      size_t start_idx = getStart(pred.size(), threadNumber_, i);
      size_t end_idx = getEnd(pred.size(), threadNumber_, i);
      pool_->enqueue(std::bind(f1_accum_thread,
                               &Y,
                               &pred,
                               &(sum_1[i]),
                               &(sum_2[i]),
                               start_idx,
                               end_idx));
    }
    // Wait all of the threads finish their job
    pool_->Sync(threadNumber_);
    for (size_t i = 0; i < sum_1.size(); ++i) {
      true_positive_ += sum_1[i];
    }
    for (size_t i = 0; i < sum_2.size(); ++i) {
      true_negative_ += sum_2[i];
    }
  }